

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O3

void TPZMatrixMarket::Read<std::complex<double>>
               (string *filename,TPZFMatrix<std::complex<double>_> *fmat)

{
  char cVar1;
  istream *piVar2;
  int64_t nonzero;
  int64_t col;
  int64_t row;
  string buf;
  int64_t ncol;
  int64_t nrow;
  ifstream input;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined8 local_268;
  undefined8 local_260;
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  local_288 = &local_278;
  local_280 = 0;
  local_278 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(fmat,local_260,local_268);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  std::ifstream::~ifstream(local_238);
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_280 = 0;
  local_278 = 0;
  local_288 = &local_278;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_288,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  (*(fmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(fmat,local_260,local_268);
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZFMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0;
    {
        std::ifstream input(filename.c_str());
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
            fmat.PutVal(row,col,val);
        }
    }
    if(nsup == 0 || nlower == 0)
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        fmat.Redim(nrow,ncol);
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            int64_t swap = row;
            row = col;
            col = swap;
            fmat.PutVal(row,col,val);
        }
    }
}